

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O0

floatx80 normalizeRoundAndPackFloatx80
                   (int8 roundingPrecision,flag zSign,int32 zExp,bits64 zSig0,bits64 zSig1)

{
  int8 iVar1;
  floatx80 fVar2;
  bits64 bStack_30;
  int8 shiftCount;
  bits64 zSig1_local;
  bits64 zSig0_local;
  int32 zExp_local;
  flag zSign_local;
  int8 roundingPrecision_local;
  
  bStack_30 = zSig1;
  zSig1_local = zSig0;
  zSig0_local._0_4_ = zExp;
  if (zSig0 == 0) {
    bStack_30 = 0;
    zSig0_local._0_4_ = zExp + -0x40;
    zSig1_local = zSig1;
  }
  zSig0_local._6_1_ = zSign;
  zSig0_local._7_1_ = roundingPrecision;
  iVar1 = countLeadingZeros64(zSig1_local);
  shortShift128Left(zSig1_local,bStack_30,(short)iVar1,&zSig1_local,&stack0xffffffffffffffd0);
  zSig0_local._0_4_ = (int32)zSig0_local - iVar1;
  fVar2 = roundAndPackFloatx80
                    (zSig0_local._7_1_,zSig0_local._6_1_,(int32)zSig0_local,zSig1_local,bStack_30);
  return fVar2;
}

Assistant:

static floatx80
	normalizeRoundAndPackFloatx80(
		int8 roundingPrecision, flag zSign, int32 zExp, bits64 zSig0, bits64 zSig1
	)
{
	int8 shiftCount;

	if ( zSig0 == 0 ) {
		zSig0 = zSig1;
		zSig1 = 0;
		zExp -= 64;
	}
	shiftCount = countLeadingZeros64( zSig0 );
	shortShift128Left( zSig0, zSig1, shiftCount, &zSig0, &zSig1 );
	zExp -= shiftCount;
	return
		roundAndPackFloatx80( roundingPrecision, zSign, zExp, zSig0, zSig1 );

}